

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_storage_info.cpp
# Opt level: O3

void duckdb::PragmaStorageInfo::RegisterFunction(BuiltinFunctions *set)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_219;
  LogicalType local_218;
  vector<duckdb::LogicalType,_true> local_200;
  string local_1e8;
  TableFunction local_1c8;
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"pragma_storage_info","");
  LogicalType::LogicalType(&local_218,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_218;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_200,__l,
             &local_219);
  TableFunction::TableFunction
            (&local_1c8,&local_1e8,&local_200,PragmaStorageInfoFunction,PragmaStorageInfoBind,
             PragmaStorageInfoInit,(table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_1c8);
  local_1c8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_0243c008;
  if (local_1c8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1c8.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_200);
  LogicalType::~LogicalType(&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PragmaStorageInfo::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(TableFunction("pragma_storage_info", {LogicalType::VARCHAR}, PragmaStorageInfoFunction,
	                              PragmaStorageInfoBind, PragmaStorageInfoInit));
}